

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O2

void remora::bindings::
     gemv_impl<remora::dense_vector_adaptor<double,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double,remora::dense_tag,remora::cpu_tag>>
               (double alpha,long *A,undefined8 x,long *result)

{
  size_t i;
  long lVar1;
  value_type value;
  double local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  for (lVar1 = 0; lVar1 != A[1]; lVar1 = lVar1 + 1) {
    local_48 = A[3] * lVar1 * 8 + *A;
    local_40 = A[2];
    local_38 = 1;
    dot<remora::dense_vector_adaptor<double_const,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double,remora::dense_tag,remora::cpu_tag>,double>
              (&local_48,x,&local_50);
    if ((local_50 != 0.0) || (NAN(local_50))) {
      *(double *)(*result + result[2] * lVar1 * 8) =
           local_50 * alpha + *(double *)(*result + result[2] * lVar1 * 8);
    }
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result, 
	typename ResultV::value_type alpha,
	row_major
) {
	typedef typename ResultV::value_type value_type;
	value_type value;
	for(std::size_t i = 0; i != A().size1();++i){
		bindings::dot(row(A,i), x, value,  typename MatA::evaluation_category::tag(), typename V::evaluation_category::tag());
		if(value != value_type())//handling of sparse results.
			result()(i) += alpha * value;
	}
}